

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryProvider.h
# Opt level: O0

void __thiscall
FIX::DataDictionaryProvider::addTransportDataDictionary
          (DataDictionaryProvider *this,BeginString *beginString,string *path)

{
  DataDictionary *this_00;
  shared_ptr<FIX::DataDictionary> local_30;
  string *local_20;
  string *path_local;
  BeginString *beginString_local;
  DataDictionaryProvider *this_local;
  
  local_20 = path;
  path_local = (string *)beginString;
  beginString_local = (BeginString *)this;
  this_00 = (DataDictionary *)operator_new(0x3e0);
  FIX::DataDictionary::DataDictionary(this_00,(string *)local_20,false);
  std::shared_ptr<FIX::DataDictionary>::shared_ptr<FIX::DataDictionary,void>(&local_30,this_00);
  FIX::DataDictionaryProvider::addTransportDataDictionary(this,beginString,&local_30);
  std::shared_ptr<FIX::DataDictionary>::~shared_ptr(&local_30);
  return;
}

Assistant:

void addTransportDataDictionary(const BeginString &beginString, const std::string &path) {
    addTransportDataDictionary(beginString, std::shared_ptr<DataDictionary>(new DataDictionary(path)));
  }